

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  NestedArray *pNVar1;
  NestedArray NVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  NestedArray *addr;
  ulong uVar6;
  
  pNVar1 = (this->nestedArray).ptr;
  addr = (other->nestedArray).ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    if (addr != (NestedArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x629,"(otherNestedArray == nullptr)",
                                  "otherNestedArray == nullptr");
      if (!bVar4) goto LAB_00769402;
      *puVar5 = 0;
    }
  }
  else {
    if (addr->nestedCount != pNVar1->nestedCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x62c,
                                  "(otherNestedArray->nestedCount == thisNestedArray->nestedCount)",
                                  "otherNestedArray->nestedCount == thisNestedArray->nestedCount");
      if (!bVar4) {
LAB_00769402:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    if (pNVar1->nestedCount != 0) {
      uVar6 = 0;
      do {
        addr = addr + 1;
        NVar2 = pNVar1[uVar6 + 1];
        Memory::Recycler::WBSetBit((char *)addr);
        *addr = NVar2;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        uVar6 = uVar6 + 1;
      } while (uVar6 < pNVar1->nestedCount);
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo * other)
    {
        NestedArray * thisNestedArray = this->GetNestedArray();
        NestedArray * otherNestedArray = other->GetNestedArray();
        if (thisNestedArray == nullptr)
        {
            Assert(otherNestedArray == nullptr);
            return;
        }
        Assert(otherNestedArray->nestedCount == thisNestedArray->nestedCount);

        for (uint i = 0; i < thisNestedArray->nestedCount; i++)
        {
            otherNestedArray->functionInfoArray[i] = thisNestedArray->functionInfoArray[i];
        }
    }